

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

void __thiscall kj::anon_unknown_8::DiskHandle::zero(DiskHandle *this,uint64_t offset,uint64_t size)

{
  int iVar1;
  iovec *__iovec;
  long lVar2;
  ssize_t sVar3;
  iovec *piVar4;
  ulong uVar5;
  size_t count;
  Fault f_1;
  Array<iovec> iov_heap;
  iovec iov_stack [16];
  
  do {
    iVar1 = fallocate((this->fd).fd,3,offset,size);
    if (-1 < iVar1) {
      return;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    if (iVar1 == 0x5f) {
      uVar5 = size + 0xfff >> 0xc;
      count = 0x400;
      if (uVar5 < 0x400) {
        count = uVar5;
      }
      if (size + 0xfff < 0x11000) {
        iov_heap.ptr = (iovec *)0x0;
        iov_heap.size_ = 0;
        iov_heap.disposer = (ArrayDisposer *)0x0;
        __iovec = iov_stack;
      }
      else {
        __iovec = _::HeapArrayDisposer::allocate<iovec>(count);
        iov_heap.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
        iov_heap.ptr = __iovec;
        iov_heap.size_ = count;
      }
      piVar4 = (iovec *)__iovec;
      for (lVar2 = count << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
        piVar4->iov_base = "";
        piVar4->iov_len = 0x1000;
        piVar4 = piVar4 + 1;
      }
      for (; size != 0; size = size - sVar3) {
        if ((size < count << 0xc) && ((size & 0xfff) != 0)) {
          *(uint64_t *)((long)&((iovec *)__iovec)->iov_len + (size >> 8 & 0xfffffffffffffff0)) =
               size & 0xfff;
        }
        while( true ) {
          sVar3 = pwritev((this->fd).fd,(iovec *)__iovec,(int)uVar5,offset);
          if (-1 < sVar3) break;
          iVar1 = _::Debug::getOsErrorNumber(false);
          if (iVar1 != -1) {
            if (iVar1 != 0) {
              _::Debug::Fault::Fault
                        (&f_1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                         ,0x1af,iVar1,"n = pwritev(fd, iov.begin(), count, offset)","");
              _::Debug::Fault::fatal(&f_1);
            }
            goto LAB_002382b5;
          }
        }
        if (sVar3 == 0) {
LAB_002382b5:
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                    (&f_1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x1b0,FAILED,"n > 0","\"pwrite() returned zero?\"",
                     (char (*) [24])"pwrite() returned zero?");
          _::Debug::Fault::fatal(&f_1);
        }
        offset = offset + sVar3;
      }
      Array<iovec>::~Array(&iov_heap);
    }
    else {
      _::Debug::Fault::Fault
                ((Fault *)iov_stack,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x187,iVar1,"fallocate(FALLOC_FL_PUNCH_HOLE)","");
      _::Debug::Fault::~Fault((Fault *)iov_stack);
    }
  }
  return;
}

Assistant:

void zero(uint64_t offset, uint64_t size) const {
#ifdef FALLOC_FL_PUNCH_HOLE
    KJ_SYSCALL_HANDLE_ERRORS(
        fallocate(fd, FALLOC_FL_PUNCH_HOLE | FALLOC_FL_KEEP_SIZE, offset, size)) {
      case EOPNOTSUPP:
        // fall back to below
        break;
      default:
        KJ_FAIL_SYSCALL("fallocate(FALLOC_FL_PUNCH_HOLE)", error) { return; }
    } else {
      return;
    }
#endif

    static const byte ZEROS[4096] = { 0 };

#if __APPLE__ || __CYGWIN__ || (defined(__ANDROID__) && __ANDROID_API__ < 24)
    // Mac & Cygwin & Android API levels 23 and lower doesn't have pwritev().
    while (size > sizeof(ZEROS)) {
      write(offset, ZEROS);
      size -= sizeof(ZEROS);
      offset += sizeof(ZEROS);
    }
    write(offset, kj::arrayPtr(ZEROS, size));
#else
    // Use a 4k buffer of zeros amplified by iov to write zeros with as few syscalls as possible.
    size_t count = (size + sizeof(ZEROS) - 1) / sizeof(ZEROS);
    const size_t iovmax = miniposix::iovMax(count);
    KJ_STACK_ARRAY(struct iovec, iov, kj::min(iovmax, count), 16, 256);

    for (auto& item: iov) {
      item.iov_base = const_cast<byte*>(ZEROS);
      item.iov_len = sizeof(ZEROS);
    }

    while (size > 0) {
      size_t iovCount;
      if (size >= iov.size() * sizeof(ZEROS)) {
        iovCount = iov.size();
      } else {
        iovCount = size / sizeof(ZEROS);
        size_t rem = size % sizeof(ZEROS);
        if (rem > 0) {
          iov[iovCount++].iov_len = rem;
        }
      }

      ssize_t n;
      KJ_SYSCALL(n = pwritev(fd, iov.begin(), count, offset));
      KJ_ASSERT(n > 0, "pwrite() returned zero?");

      offset += n;
      size -= n;
    }
#endif
  }